

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::ShowMetricsWindow(bool *p_popen)

{
  ImPlotColormapData *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImPlotContext *this_00;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ImU32 IVar7;
  int iVar8;
  ImDrawList *this_01;
  ImGuiIO *pIVar9;
  ImPlotPlot *pIVar10;
  ImPlotItem *pIVar11;
  ImGuiStyle *pIVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  int m;
  int cmap;
  uint uVar16;
  float fVar17;
  ImVec4 temp;
  ImVec4 col;
  
  this_01 = ImGui::GetForegroundDrawList();
  this_00 = GImPlot;
  pIVar9 = ImGui::GetIO();
  ImGui::Begin("ImPlot Metrics",p_popen,0);
  ImGui::Text("ImPlot 0.10 WIP");
  ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
              SUB84((double)(1000.0 / pIVar9->Framerate),0),(double)pIVar9->Framerate);
  ImGui::Separator();
  bVar4 = ImGui::TreeNode("Tools");
  if (bVar4) {
    auVar1._8_8_ = 0;
    auVar1._0_4_ = temp.z;
    auVar1._4_4_ = temp.w;
    temp = (ImVec4)(auVar1 << 0x40);
    bVar4 = ImGui::Button("Bust Plot Cache",(ImVec2 *)&temp);
    if (bVar4) {
      BustPlotCache();
    }
    ImGui::SameLine(0.0,-1.0);
    auVar2._8_8_ = 0;
    auVar2._0_4_ = temp.z;
    auVar2._4_4_ = temp.w;
    temp = (ImVec4)(auVar2 << 0x40);
    bVar4 = ImGui::Button("Bust Item Cache",(ImVec2 *)&temp);
    if (bVar4) {
      BustItemCache();
    }
    ImGui::Checkbox("Show Plot Rects",&ShowMetricsWindow::show_plot_rects);
    ImGui::Checkbox("Show Axes Rects",&ShowMetricsWindow::show_axes_rects);
    ImGui::TreePop();
  }
  uVar5 = ImPool<ImPlotPlot>::GetBufSize(&this_00->Plots);
  bVar4 = ImGui::TreeNode("Plots","Plots (%d)",(ulong)uVar5);
  if (bVar4) {
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
      pIVar10 = ImVector<ImPlotPlot>::operator[]((ImVector<ImPlotPlot> *)this_00,uVar16);
      ImGui::PushID(uVar16);
      bVar4 = ImGui::TreeNode("Plot","Plot [ID=%u]",(ulong)pIVar10->ID);
      if (bVar4) {
        uVar6 = ImPool<ImPlotItem>::GetBufSize(&pIVar10->Items);
        bVar4 = ImGui::TreeNode("Items","Items (%d)",(ulong)uVar6);
        if (bVar4) {
          uVar14 = 0;
          if ((int)uVar6 < 1) {
            uVar6 = uVar14;
          }
          for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
            pIVar11 = ImVector<ImPlotItem>::operator[](&(pIVar10->Items).Buf,uVar14);
            ImGui::PushID(uVar14);
            bVar4 = ImGui::TreeNode("Item","Item [ID=%u]",(ulong)pIVar11->ID);
            if (bVar4) {
              ImGui::Bullet();
              ImGui::Checkbox("Show",&pIVar11->Show);
              ImGui::Bullet();
              temp = ImGui::ColorConvertU32ToFloat4(pIVar11->Color);
              bVar4 = ImGui::ColorEdit4("Color",&temp.x,0x20);
              if (bVar4) {
                IVar7 = ImGui::ColorConvertFloat4ToU32(&temp);
                pIVar11->Color = IVar7;
              }
              ImGui::Bullet();
              ImGui::Text("NameOffset: %d",(ulong)(uint)pIVar11->NameOffset);
              ImGui::Bullet();
              pcVar13 = (pIVar10->LegendData).Labels.Buf.Data + pIVar11->NameOffset;
              if ((long)pIVar11->NameOffset == -1) {
                pcVar13 = "N/A";
              }
              ImGui::Text("Name: %s",pcVar13);
              ImGui::Bullet();
              pcVar13 = "false";
              if (pIVar11->LegendHovered != false) {
                pcVar13 = "true";
              }
              ImGui::Text("Hovered: %s",pcVar13);
              ImGui::TreePop();
            }
            ImGui::PopID();
          }
          ImGui::TreePop();
        }
        bVar4 = ImGui::TreeNode("X-Axis");
        if (bVar4) {
          ShowAxisMetrics(&pIVar10->XAxis,ShowMetricsWindow::show_axes_rects);
          ImGui::TreePop();
        }
        bVar4 = ImGui::TreeNode("Y-Axis");
        if (bVar4) {
          ShowAxisMetrics(pIVar10->YAxis,ShowMetricsWindow::show_axes_rects);
          ImGui::TreePop();
        }
        if (((pIVar10->Flags & 0x100) != 0) && (bVar4 = ImGui::TreeNode("Y-Axis 2"), bVar4)) {
          ShowAxisMetrics(pIVar10->YAxis + 1,ShowMetricsWindow::show_axes_rects);
          ImGui::TreePop();
        }
        if (((pIVar10->Flags & 0x200) != 0) && (bVar4 = ImGui::TreeNode("Y-Axis 3"), bVar4)) {
          ShowAxisMetrics(pIVar10->YAxis + 2,ShowMetricsWindow::show_axes_rects);
          ImGui::TreePop();
        }
        ImGui::Bullet();
        ImGui::Text("Flags: %d",(ulong)(uint)pIVar10->Flags);
        ImGui::Bullet();
        pcVar15 = "false";
        pcVar13 = "false";
        if (pIVar10->Initialized != false) {
          pcVar13 = "true";
        }
        ImGui::Text("Initialized: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->Selecting != false) {
          pcVar13 = "true";
        }
        ImGui::Text("Selecting: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->Selected != false) {
          pcVar13 = "true";
        }
        ImGui::Text("Selected: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->Querying != false) {
          pcVar13 = "true";
        }
        ImGui::Text("Querying: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->Queried != false) {
          pcVar13 = "true";
        }
        ImGui::Text("Queried: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->FrameHovered != false) {
          pcVar13 = "true";
        }
        ImGui::Text("FrameHovered: %s",pcVar13);
        ImGui::Bullet();
        pcVar13 = "false";
        if (pIVar10->PlotHovered != false) {
          pcVar13 = "true";
        }
        ImGui::Text("PlotHovered: %s",pcVar13);
        ImGui::Bullet();
        if (pIVar10->LegendHovered != false) {
          pcVar15 = "true";
        }
        ImGui::Text("LegendHovered: %s",pcVar15);
        ImGui::TreePop();
        if (ShowMetricsWindow::show_plot_rects == true) {
          ImDrawList::AddRect(this_01,&(pIVar10->PlotRect).Min,&(pIVar10->PlotRect).Max,0xff00ffff,
                              0.0,0,1.0);
        }
      }
      ImGui::PopID();
    }
    ImGui::TreePop();
  }
  bVar4 = ImGui::TreeNode("Colormaps");
  if (bVar4) {
    iVar8 = 0;
    ImGui::BulletText("Colormaps:  %d",(ulong)(uint)(this_00->ColormapData).Count);
    ImGui::BulletText("Memory: %d bytes",(ulong)(uint)((this_00->ColormapData).Tables.Size << 2));
    bVar4 = ImGui::TreeNode("Data");
    if (bVar4) {
      this = &this_00->ColormapData;
      for (cmap = 0; cmap < (this_00->ColormapData).Count; cmap = cmap + 1) {
        pcVar13 = ImPlotColormapData::GetName(this,cmap);
        bVar4 = ImGui::TreeNode(pcVar13);
        if (bVar4) {
          uVar5 = ImPlotColormapData::GetKeyCount(this,cmap);
          uVar16 = ImPlotColormapData::GetTableSize(this,cmap);
          bVar4 = ImPlotColormapData::IsQual(this,cmap);
          pcVar13 = "false";
          if (bVar4) {
            pcVar13 = "true";
          }
          uVar6 = 0;
          ImGui::BulletText("Qualitative: %s",pcVar13);
          ImGui::BulletText("Key Count: %d",(ulong)uVar5);
          ImGui::BulletText("Table Size: %d",(ulong)uVar16);
          ImGui::Indent(0.0);
          temp = (ImVec4)ZEXT816(0);
          fVar17 = ImGui::GetFrameHeight();
          pIVar12 = ImGui::GetStyle();
          ImGui::SetNextItemWidth((320.0 - fVar17) - (pIVar12->ItemSpacing).x);
          ColormapSlider("##Sample",&ShowMetricsWindow::t,&temp,"%.3f",cmap);
          ImGui::SameLine(0.0,-1.0);
          ImGui::ColorButton("Sampler",&temp,0,(ImVec2)0x0);
          col = (ImVec4)ZEXT816(0);
          ImGui::PushStyleColor(7,&col);
          auVar3._8_8_ = 0;
          auVar3._0_4_ = col.z;
          auVar3._4_4_ = col.w;
          col = (ImVec4)(auVar3 << 0x40);
          ImGui::PushStyleVar(0xd,(ImVec2 *)&col);
          uVar5 = uVar16;
          if ((int)uVar16 < 1) {
            uVar5 = uVar6;
          }
          while (uVar5 != uVar6) {
            IVar7 = ImPlotColormapData::GetTableColor(this,cmap,uVar6);
            col = ImGui::ColorConvertU32ToFloat4(IVar7);
            ImGui::PushID(iVar8 + uVar6);
            ImGui::ColorButton("",&col,0,(ImVec2)0x4120000041200000);
            ImGui::PopID();
            uVar14 = uVar6 + 1;
            bVar4 = uVar16 - 1 != uVar6;
            uVar6 = uVar14;
            if (bVar4 && (uVar14 & 0x1f) != 0) {
              ImGui::SameLine(0.0,-1.0);
            }
          }
          ImGui::PopStyleVar(1);
          ImGui::PopStyleColor(1);
          ImGui::Unindent(0.0);
          ImGui::TreePop();
        }
        iVar8 = iVar8 + 1000;
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  ImGui::End();
  return;
}

Assistant:

void ShowMetricsWindow(bool* p_popen) {

    static bool show_plot_rects = false;
    static bool show_axes_rects = false;

    ImDrawList& fg = *ImGui::GetForegroundDrawList();

    ImPlotContext& gp = *GImPlot;
    // ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Begin("ImPlot Metrics", p_popen);
    ImGui::Text("ImPlot " IMPLOT_VERSION);
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Separator();
    if (ImGui::TreeNode("Tools")) {
        if (ImGui::Button("Bust Plot Cache"))
            BustPlotCache();
        ImGui::SameLine();
        if (ImGui::Button("Bust Item Cache"))
            BustItemCache();
        ImGui::Checkbox("Show Plot Rects", &show_plot_rects);
        ImGui::Checkbox("Show Axes Rects", &show_axes_rects);
        ImGui::TreePop();
    }
    const int n_plots = gp.Plots.GetBufSize();
    if (ImGui::TreeNode("Plots","Plots (%d)", n_plots)) {
        for (int p = 0; p < n_plots; ++p) {
            // plot
            ImPlotPlot* plot = gp.Plots.GetByIndex(p);
            ImGui::PushID(p);
            if (ImGui::TreeNode("Plot", "Plot [ID=%u]", plot->ID)) {
                int n_items = plot->Items.GetBufSize();
                if (ImGui::TreeNode("Items", "Items (%d)", n_items)) {
                    for (int i = 0; i < n_items; ++i) {
                        ImPlotItem* item = plot->Items.GetByIndex(i);
                        ImGui::PushID(i);
                        if (ImGui::TreeNode("Item", "Item [ID=%u]", item->ID)) {
                            ImGui::Bullet(); ImGui::Checkbox("Show", &item->Show);
                            ImGui::Bullet();
                            ImVec4 temp = ImGui::ColorConvertU32ToFloat4(item->Color);
                            if (ImGui::ColorEdit4("Color",&temp.x, ImGuiColorEditFlags_NoInputs))
                                item->Color = ImGui::ColorConvertFloat4ToU32(temp);

                            ImGui::Bullet(); ImGui::Text("NameOffset: %d",item->NameOffset);
                            ImGui::Bullet(); ImGui::Text("Name: %s", item->NameOffset != -1 ? plot->LegendData.Labels.Buf.Data + item->NameOffset : "N/A");
                            ImGui::Bullet(); ImGui::Text("Hovered: %s",item->LegendHovered ? "true" : "false");
                            ImGui::TreePop();
                        }
                        ImGui::PopID();
                    }
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("X-Axis")) {
                    ShowAxisMetrics(&plot->XAxis, show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("Y-Axis")) {
                    ShowAxisMetrics(&plot->YAxis[0], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis2) && ImGui::TreeNode("Y-Axis 2")) {
                    ShowAxisMetrics(&plot->YAxis[1], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis3) && ImGui::TreeNode("Y-Axis 3")) {
                    ShowAxisMetrics(&plot->YAxis[2], show_axes_rects);
                    ImGui::TreePop();
                }
                ImGui::Bullet(); ImGui::Text("Flags: %d", plot->Flags);
                ImGui::Bullet(); ImGui::Text("Initialized: %s", plot->Initialized ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selecting: %s", plot->Selecting ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selected: %s", plot->Selected ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Querying: %s", plot->Querying ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Queried: %s", plot->Queried ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("FrameHovered: %s", plot->FrameHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("PlotHovered: %s", plot->PlotHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("LegendHovered: %s", plot->LegendHovered ? "true" : "false");
                ImGui::TreePop();
                if (show_plot_rects)
                    fg.AddRect(plot->PlotRect.Min, plot->PlotRect.Max, IM_COL32(255,255,0,255));
            }
            ImGui::PopID();
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Colormaps")) {
        ImGui::BulletText("Colormaps:  %d", gp.ColormapData.Count);
        ImGui::BulletText("Memory: %d bytes", gp.ColormapData.Tables.Size * 4);
        if (ImGui::TreeNode("Data")) {
            for (int m = 0; m < gp.ColormapData.Count; ++m) {
                if (ImGui::TreeNode(gp.ColormapData.GetName(m))) {
                    int count = gp.ColormapData.GetKeyCount(m);
                    int size = gp.ColormapData.GetTableSize(m);
                    bool qual = gp.ColormapData.IsQual(m);
                    ImGui::BulletText("Qualitative: %s", qual ? "true" : "false");
                    ImGui::BulletText("Key Count: %d", count);
                    ImGui::BulletText("Table Size: %d", size);
                    ImGui::Indent();

                    static float t = 0.5;
                    ImVec4 samp;
                    float wid = 32 * 10 - ImGui::GetFrameHeight() - ImGui::GetStyle().ItemSpacing.x;
                    ImGui::SetNextItemWidth(wid);
                    ImPlot::ColormapSlider("##Sample",&t,&samp,"%.3f",m);
                    ImGui::SameLine();
                    ImGui::ColorButton("Sampler",samp);
                    ImGui::PushStyleColor(ImGuiCol_FrameBg, ImVec4(0,0,0,0));
                    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
                    for (int c = 0; c < size; ++c) {
                        ImVec4 col = ImGui::ColorConvertU32ToFloat4(gp.ColormapData.GetTableColor(m,c));
                        ImGui::PushID(m*1000+c);
                        ImGui::ColorButton("",col,0,ImVec2(10,10));
                        ImGui::PopID();
                        if ((c + 1) % 32 != 0 && c != size - 1)
                            ImGui::SameLine();
                    }
                    ImGui::PopStyleVar();
                    ImGui::PopStyleColor();
                    ImGui::Unindent();
                    ImGui::TreePop();
                }
            }
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }
    ImGui::End();
}